

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::FillPatchIterator::FillPatchIterator
          (FillPatchIterator *this,AmrLevel *amrlevel,MultiFab *leveldata)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  element_type *in_RSI;
  MultiFab *in_RDI;
  uchar unaff_retaddr;
  FabArrayBase *in_stack_00000008;
  
  MFIter::MFIter((MFIter *)leveldata,in_stack_00000008,unaff_retaddr);
  (in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_simplified_list.
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RSI;
  (in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_simplified_list.
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x10f9739);
  MultiFab::MultiFab(in_RDI);
  *(undefined4 *)
   ((long)&in_RDI[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.indexArray.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = 0;
  MFIter::depth = 0;
  return;
}

Assistant:

FillPatchIterator::FillPatchIterator (AmrLevel& amrlevel,
                                      MultiFab& leveldata)
    :
    MFIter(leveldata),
    m_amrlevel(amrlevel),
    m_leveldata(leveldata),
    m_ncomp(0)
{
    MFIter::depth = 0;
}